

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O0

int lj_ffh_string_byte(lua_State *L)

{
  MSize MVar1;
  MSize MVar2;
  uint uVar3;
  GCstr *pGVar4;
  long in_RDI;
  uchar *p;
  int32_t i;
  int32_t n;
  int32_t stop;
  int32_t start;
  int32_t len;
  GCstr *s;
  ErrMsg in_stack_ffffffffffffffac;
  lua_State *in_stack_ffffffffffffffb0;
  int32_t in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int iVar5;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int local_38;
  int local_20;
  
  pGVar4 = lj_lib_checkstr((lua_State *)
                           CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                           in_stack_ffffffffffffffbc);
  MVar1 = pGVar4->len;
  local_38 = lj_lib_optint((lua_State *)
                           CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                           in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  MVar2 = lj_lib_optint((lua_State *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  if ((int)MVar2 < 0) {
    MVar2 = MVar1 + 1 + MVar2;
  }
  if (local_38 < 0) {
    local_38 = MVar1 + 1 + local_38;
  }
  if (local_38 < 1) {
    local_38 = 1;
  }
  if ((int)MVar1 < (int)MVar2) {
    MVar2 = MVar1;
  }
  if ((int)MVar2 < local_38) {
    local_20 = 1;
  }
  else {
    uVar3 = MVar2 - (local_38 + -1);
    if (8000 < uVar3) {
      lj_err_caller(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    }
    if ((long)((ulong)*(uint *)(in_RDI + 0x20) - *(long *)(in_RDI + 0x18)) <=
        (long)((ulong)uVar3 * 8)) {
      lj_state_growstack(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    }
    for (iVar5 = 0; iVar5 < (int)uVar3; iVar5 = iVar5 + 1) {
      *(double *)(*(long *)(in_RDI + 0x10) + (long)iVar5 * 8 + -8) =
           (double)*(byte *)((long)&pGVar4[1].nextgc.gcptr32 + (long)iVar5 + (long)(local_38 + -1));
    }
    local_20 = uVar3 + 1;
  }
  return local_20;
}

Assistant:

LJLIB_ASM(string_byte)		LJLIB_REC(string_range 0)
{
  GCstr *s = lj_lib_checkstr(L, 1);
  int32_t len = (int32_t)s->len;
  int32_t start = lj_lib_optint(L, 2, 1);
  int32_t stop = lj_lib_optint(L, 3, start);
  int32_t n, i;
  const unsigned char *p;
  if (stop < 0) stop += len+1;
  if (start < 0) start += len+1;
  if (start <= 0) start = 1;
  if (stop > len) stop = len;
  if (start > stop) return FFH_RES(0);  /* Empty interval: return no results. */
  start--;
  n = stop - start;
  if ((uint32_t)n > LUAI_MAXCSTACK)
    lj_err_caller(L, LJ_ERR_STRSLC);
  lj_state_checkstack(L, (MSize)n);
  p = (const unsigned char *)strdata(s) + start;
  for (i = 0; i < n; i++)
    setintV(L->base + i-1, p[i]);
  return FFH_RES(n);
}